

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_with_precreated_compressed_arrays_Test::
~ZLIBBufferCompressorTest_test_with_precreated_compressed_arrays_Test
          (ZLIBBufferCompressorTest_test_with_precreated_compressed_arrays_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  
  (this->super_ZLIBBufferCompressorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ZLIBBufferCompressorTest_0029d068;
  puVar2 = (this->super_ZLIBBufferCompressorTest).TROUBLING_BUFFER.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->super_ZLIBBufferCompressorTest).TROUBLING_BUFFER.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_ZLIBBufferCompressorTest).SMALL_TEXT._M_dataplus._M_p;
  paVar1 = &(this->super_ZLIBBufferCompressorTest).SMALL_TEXT.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_with_precreated_compressed_arrays)
{
    // these were created by compressing data 1.7.0.51 or java 1.8.0_66 with the new way of flushing
    std::string small_input = "73696d706c652074657374206f6620636f6d7072657373696f6e";
    std::vector<unsigned char> bytes = HexEncoder::DecodeFromHex(small_input);
    ByteBuffer result1 = BufferUtil::HexBuffer("2acecc2dc8495528492d2e51c84f5348cecf2d284a2d2ececccf03000000ffff");
    InflateAndCheck(bytes, result1);

    std::string bigger_input = "445543413a42656c6c61206669676c69612064656c6c27616d6f72652c7363686961766f20736f6e2064652776657a7a692074756f693b636f6e20756e20646574746f2c20756e20646574746f20736f6c74752070756f69206c65206d69652070656e652c6c65206d69652070656e6520636f6e736f6c61722e5669656e6920652073656e74692064656c206d696f20636f7265696c206672657175656e74652070616c70697461722c636f6e20756e20646574746f2c20756e20646574746f20736f6c74752070756f69206c65206d69652070656e652c6c65206d69652070656e6520636f6e736f6c61722e4d414444414c454e413a41682120616821207269646f2062656e20646920636f72652c206368c3a820746169206261696520636f7374616e20706f636f3b47494c44413a41682120636f73c3ac207061726c6172206427616d6f72654d414444414c454e413a5175616e746f2076616c676120696c20766f7374726f2067696f636f2c206d656c20637265646574652c2073c3b22061707072657a7a61722e47494c44413a41206d6520707572206c27696e66616d6520686f20756469746f215249474f4c4554544f3a20546163692c20696c207069616e67657265206e6f6e2076616c653b47494c44413a2020202020496e66656c69636520636f72207472616469746f2c4d414444414c454e413a20536f6e20617676657a7a612c2062656c207369676e6f72652c445543413a202020202020436f6e20756e2020646574746f5249474f4c4554544f3a20546163692c20207461636920696c20207069616e67657265206e6f6e202076616c652c206e6f2c206e6f6e2c2076616c2c47494c44413a202020202050657220616e676f73636961206e6f6e2073636f70706961722c4d414444414c454e413a20416420756e2073696d696c652073636865727a6172652c445543413a202020202020536f6c207475202070756f695249474f4c4554544f3a206e6f2c206e6f2c206e6f6e2c2076616c2e47494c44413a20202020206e6f2c206e6f206e6f6e2c2073636f70706961722e4d414444414c454e413a206d696f2062656c207369676e6f7221445543413a2020202020206c65206d69652070656e6520636f6e736f6c61722e2042656c6c61206669676c69612064656c6c27616d6f72652c5249474f4c4554544f3a204368276569206d656e746976612c47494c44413a2020202020496e2066656c6963654d414444414c454e413a2041682120616821207269646f2062656e20646920636f72652c206368c3a820746169206261696520636f7374616e2020706f636f2c445543413a2020202020207363686961766f20736f6e2064652776657a7a692074756f693b5249474f4c4554544f3a204368276569206d656e746976612c47494c44413a2020202020636f72207472616469746f2c4d414444414c454e413a205175616e746f2076616c676120696c20766f7374726f2067696f636f2c206d656c20637265646574652c2073c3b22061707072657a7a61722e445543413a202020202020436f6e20756e20646574746f2c20756e20646574746f20736f6c2074755249474f4c4554544f3a207365692073696375726147494c44413a20416821204e6f2c206e6f6e2073636f70706961722e4d414444414c454e413a20536f6e6f20617676657a7a612c2062656c207369676e6f72652c20616420756e2073696d696c652073636865727a6172652e445543413a20202020202070756f69206c65206d69652070656e652c206c65206d69652070656e6520636f6e736f6c61722e5249474f4c4554544f3a20546163692c2065206d696120736172c3a0206c61206375726147494c44413a2020202020496e2066656c69636520636f72652c20636f72207472616469746f2c4d414444414c454e413a20416821204168212041682120416821205269646f20646920636f722c445543413a20202020202041682120436f6e20756e20646574746f5249474f4c4554544f3a204c612076656e64657474612064276166667265747461722c47494c44413a202020202050657220616e676f73636961206e6f6e2073636f7070696172652c4d414444414c454e413a2041682120416821205269646f20646920636f722c445543413a202020202020736f6c2074752070756f695249474f4c4554544f3a20546163692c2065206d696120736172c3a0206c61206375726147494c44413a2020202020496e2066656c69636520636f72207472616469746f2c4d414444414c454e413a2041682c2041682c205269646f20646920636f722c445543413a2020202020204c65206d69652070656e652c5249474f4c4554544f3a204c612076656e64657474612064276166667265747461722e47494c44413a2050657220616e676f73636961206e6f6e2073636f7070696172652c4d414444414c454e413a2041682120416821205269646f2c445543413a202020202020636f6e736f6c6172";
    bytes = HexEncoder::DecodeFromHex(bigger_input);
    ByteBuffer result2 = BufferUtil::HexBuffer(
            "ac54c16e1a3110fd95e1c4c5ca079013852842a2499bd0de27cb0023197b6befee215fd3630f3df517f8b13eef4231655142d5952cadedf1cc9bf79e3dfd32198f3e88b54c2b5d5b655a6232e4ad0f6262b1516e3c45efb03c6ce4f555a9aabdde1658a9d3625579f3e70f81b6aaa9440459a1ad0a95e2c464ff849388e270f355c52909457195a6aa88f1d80ea2965641bed5d8c021b6a5561ccc7f28f9713c9d8ee7770fe3d1783320c608baf4f42248a66d6943c566f7832a567a614d4763c58e4a5ff8dbfbd97cda9dc4eaee27900524a56547d631f7e79a1d80356cd74ce8a5418ee069ad4862688b468b20008f6271f78bb82c038805bc7d0184a09f4076a86ec5986c3cd54badfce06976ff38bf5b2c1e47b4e0424dca5e2abbb50421077e5053f638297d33b712ab45ea23501538653147a4f48c33dc245dd980064b51d72ed1304db66853d0a4e3bda3fb0c01a82a34e13805d22231f84dc399343519ae4f1208d13e16305c8a8f852f9120e4e0c6cb5437ea562126ac2801249d407bf61676a456fd0c5957f558f926abdcad775b87a2992f5a0f1e891864c57a1d4597ae4e0667b2198a4254d8bc6173a20e75f2e44d5f67ccd699392597afec7b105db0c93f3bfadc463dd717f0326c11c8a21675e03daec4c843a766af62f0b0ef373171af83725467ef46bfcc67b64f414c91c3ee3b41ff0cee89b007e9fa694d9de5e32969dee99d4b9ab672f6323073a6465c5ae5f40eadf06c56e9ad7ccf55933e281720742afd7dcfaea6a29f04d38e0b95e799366f377eb8e9d7379dd73cc8fe1b0000ffff");
    InflateAndCheck(bytes, result2);

    // these were created by compressing data in java 1.6.0.24 or 1.7.0.51 with the old way of flushing
    bytes = HexEncoder::DecodeFromHex(small_input);
    ByteBuffer result3 = BufferUtil::HexBuffer("2acecc2dc8495528492d2e51c84f5348cecf2d284a2d2ececccf0308000000ffff02");
    InflateAndCheck(bytes, result3);

    bytes = HexEncoder::DecodeFromHex(bigger_input);
    ByteBuffer result4 = BufferUtil::HexBuffer("ac54c16e1a3110fd95e1c4c5ca079013852842a2499bd0de27cb0023197b6befee215fd3630f3df517f8b13eef4231655142d5952cadedf1cc9bf79e3dfd32198f3e88b54c2b5d5b655a6232e4ad0f6262b1516e3c45efb03c6ce4f555a9aabdde1658a9d3625579f3e70f81b6aaa9440459a1ad0a95e2c464ff849388e270f355c52909457195a6aa88f1d80ea2965641bed5d8c021b6a5561ccc7f28f9713c9d8ee7770fe3d1783320c608baf4f42248a66d6943c566f7832a567a614d4763c58e4a5ff8dbfbd97cda9dc4eaee27900524a56547d631f7e79a1d80356cd74ce8a5418ee069ad4862688b468b20008f6271f78bb82c038805bc7d0184a09f4076a86ec5986c3cd54badfce06976ff38bf5b2c1e47b4e0424dca5e2abbb50421077e5053f638297d33b712ab45ea23501538653147a4f48c33dc245dd980064b51d72ed1304db66853d0a4e3bda3fb0c01a82a34e13805d22231f84dc399343519ae4f1208d13e16305c8a8f852f9120e4e0c6cb5437ea562126ac2801249d407bf61676a456fd0c5957f558f926abdcad775b87a2992f5a0f1e891864c57a1d4597ae4e0667b2198a4254d8bc6173a20e75f2e44d5f67ccd699392597afec7b105db0c93f3bfadc463dd717f0326c11c8a21675e03daec4c843a766af62f0b0ef373171af83725467ef46bfcc67b64f414c91c3ee3b41ff0cee89b007e9fa694d9de5e32969dee99d4b9ab672f6323073a6465c5ae5f40eadf06c56e9ad7ccf55933e281720742afd7dcfaea6a29f04d38e0b95e799366f377eb8e9d7379dd73cc8fe5b00000000ffff02");
    InflateAndCheck(bytes, result4);
}